

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenerators::ParseForUic
          (cmQtAutoGenerators *this,string *absFilename,string *contentsString,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *includedUis)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  mapped_type *this_00;
  size_type sVar4;
  long lVar5;
  string local_190 [32];
  undefined1 local_170 [8];
  string basename;
  string currentUi;
  undefined1 local_120 [8];
  string realName;
  size_type matchOffset;
  RegularExpression uiIncludeRegExp;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *includedUis_local;
  string *contentsString_local;
  string *absFilename_local;
  cmQtAutoGenerators *this_local;
  
  uiIncludeRegExp.searchstring = (char *)includedUis;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::RegularExpression::RegularExpression
              ((RegularExpression *)&matchOffset,
               "[\n][ \t]*#[ \t]*include[ \t]+[\"<](([^ \">]+/)?ui_[^ \">/]+\\.h)[\">]");
    realName.field_2._8_8_ = 0;
    cmsys::SystemTools::GetRealPath((string *)local_120,absFilename,(string *)0x0);
    realName.field_2._8_8_ = 0;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pcVar3 = strstr(pcVar3,"ui_");
    if ((pcVar3 != (char *)0x0) &&
       (bVar1 = cmsys::RegularExpression::find((RegularExpression *)&matchOffset,contentsString),
       bVar1)) {
      do {
        cmsys::RegularExpression::match_abi_cxx11_
                  ((string *)((long)&basename.field_2 + 8),(RegularExpression *)&matchOffset,1);
        cmsys::SystemTools::GetFilenameWithoutLastExtension
                  ((string *)local_170,(string *)((long)&basename.field_2 + 8));
        std::__cxx11::string::substr((ulong)local_190,(ulong)local_170);
        std::__cxx11::string::operator=((string *)local_170,local_190);
        std::__cxx11::string::~string(local_190);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                *)uiIncludeRegExp.searchstring,(key_type *)local_120);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,(value_type *)local_170);
        sVar4 = cmsys::RegularExpression::end((RegularExpression *)&matchOffset);
        realName.field_2._8_8_ = sVar4 + realName.field_2._8_8_;
        std::__cxx11::string::~string((string *)local_170);
        std::__cxx11::string::~string((string *)(basename.field_2._M_local_buf + 8));
        lVar5 = std::__cxx11::string::c_str();
        bVar1 = cmsys::RegularExpression::find
                          ((RegularExpression *)&matchOffset,
                           (char *)(lVar5 + realName.field_2._8_8_));
      } while (bVar1);
    }
    std::__cxx11::string::~string((string *)local_120);
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)&matchOffset);
  }
  return;
}

Assistant:

void cmQtAutoGenerators::ParseForUic(const std::string& absFilename,
                const std::string& contentsString,
                std::map<std::string, std::vector<std::string> >& includedUis)
{
  if (this->UicExecutable.empty())
    {
    return;
    }
  cmsys::RegularExpression uiIncludeRegExp(
              "[\n][ \t]*#[ \t]*include[ \t]+"
              "[\"<](([^ \">]+/)?ui_[^ \">/]+\\.h)[\">]");

  std::string::size_type matchOffset = 0;

  const std::string realName =
                   cmsys::SystemTools::GetRealPath(absFilename);

  matchOffset = 0;
  if ((strstr(contentsString.c_str(), "ui_") != NULL)
                                    && (uiIncludeRegExp.find(contentsString)))
    {
    do
      {
      const std::string currentUi = uiIncludeRegExp.match(1);

      std::string basename = cmsys::SystemTools::
                                  GetFilenameWithoutLastExtension(currentUi);

      // basename should be the part of the ui filename used for
      // finding the correct header, so we need to remove the ui_ part
      basename = basename.substr(3);

      includedUis[realName].push_back(basename);

      matchOffset += uiIncludeRegExp.end();
      } while(uiIncludeRegExp.find(contentsString.c_str() + matchOffset));
    }
}